

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

NetType cfd::core::GetNetworkTypeFromVersion(uint32_t version)

{
  NetType NVar1;
  KeyFormatData local_80;
  
  GetKeyFormatFromVersion(&local_80,version);
  NVar1 = KeyFormatData::GetNetType(&local_80);
  KeyFormatData::~KeyFormatData(&local_80);
  return NVar1;
}

Assistant:

static NetType GetNetworkTypeFromVersion(uint32_t version) {
  return GetKeyFormatFromVersion(version).GetNetType();
}